

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O3

void absl::lts_20250127::internal_any_invocable::RemoteManagerTrivial
               (FunctionToCall operation,TypeErasedState *from,TypeErasedState *to)

{
  size_t sVar1;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,operation) != 0) {
    operator_delete((from->remote).target,(from->remote).size);
    return;
  }
  sVar1 = (from->remote).size;
  (to->remote).target = (from->remote).target;
  (to->remote).size = sVar1;
  return;
}

Assistant:

inline void RemoteManagerTrivial(FunctionToCall operation,
                                 TypeErasedState* const from,
                                 TypeErasedState* const to) noexcept {
  switch (operation) {
    case FunctionToCall::relocate_from_to:
      // NOTE: Requires that the left-hand operand is already empty.
      to->remote = from->remote;
      return;
    case FunctionToCall::dispose:
#if defined(__cpp_sized_deallocation)
      ::operator delete(from->remote.target, from->remote.size);
#else   // __cpp_sized_deallocation
      ::operator delete(from->remote.target);
#endif  // __cpp_sized_deallocation
      return;
  }
  ABSL_UNREACHABLE();
}